

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int mbedtls_base64_encode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  byte *pbVar6;
  uchar *puVar7;
  uint local_6c;
  uchar *local_60;
  uchar *p;
  int C3;
  int C2;
  int C1;
  size_t n;
  size_t i;
  size_t slen_local;
  uchar *src_local;
  size_t *olen_local;
  size_t dlen_local;
  uchar *dst_local;
  
  if (slen == 0) {
    *olen = 0;
    dst_local._4_4_ = 0;
  }
  else {
    uVar4 = slen / 3 + (long)(int)(uint)(slen % 3 != 0);
    if (uVar4 < 0x4000000000000000) {
      lVar5 = uVar4 * 4;
      if ((dlen < lVar5 + 1U) || (dst == (uchar *)0x0)) {
        *olen = lVar5 + 1;
        dst_local._4_4_ = -0x2a;
      }
      else {
        local_60 = dst;
        slen_local = (size_t)src;
        for (n = 0; puVar7 = local_60, n < (slen / 3) * 3; n = n + 3) {
          bVar1 = *(byte *)slen_local;
          pbVar6 = (byte *)(slen_local + 2);
          bVar2 = *(byte *)(slen_local + 1);
          slen_local = slen_local + 3;
          bVar3 = *pbVar6;
          *local_60 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(int)(uint)bVar1 >> 2];
          local_60[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(int)((bVar1 & 3) * 0x10 + ((int)(uint)bVar2 >> 4) & 0x3f)];
          puVar7 = local_60 + 3;
          local_60[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(int)((bVar2 & 0xf) * 4 + ((int)(uint)bVar3 >> 6) & 0x3f)];
          local_60 = local_60 + 4;
          *puVar7 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)(bVar3 & 0x3f)];
        }
        if (n < slen) {
          bVar1 = *(byte *)slen_local;
          if (n + 1 < slen) {
            local_6c = (uint)*(byte *)(slen_local + 1);
          }
          else {
            local_6c = 0;
          }
          *local_60 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(int)(uint)bVar1 >> 2];
          local_60[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(int)((bVar1 & 3) * 0x10 + ((int)local_6c >> 4) & 0x3f)];
          if (n + 1 < slen) {
            local_60[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                          [(int)((local_6c & 0xf) << 2)];
          }
          else {
            local_60[2] = '=';
          }
          local_60 = local_60 + 3;
          *local_60 = '=';
          local_60 = puVar7 + 4;
        }
        *olen = (long)local_60 - (long)dst;
        *local_60 = '\0';
        dst_local._4_4_ = 0;
      }
    }
    else {
      *olen = 0xffffffffffffffff;
      dst_local._4_4_ = -0x2a;
    }
  }
  return dst_local._4_4_;
}

Assistant:

int mbedtls_base64_encode( unsigned char *dst, size_t dlen, size_t *olen,
                   const unsigned char *src, size_t slen )
{
    size_t i, n;
    int C1, C2, C3;
    unsigned char *p;

    if( slen == 0 )
    {
        *olen = 0;
        return( 0 );
    }

    n = slen / 3 + ( slen % 3 != 0 );

    if( n > ( BASE64_SIZE_T_MAX - 1 ) / 4 )
    {
        *olen = BASE64_SIZE_T_MAX;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    n *= 4;

    if( ( dlen < n + 1 ) || ( NULL == dst ) )
    {
        *olen = n + 1;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    n = ( slen / 3 ) * 3;

    for( i = 0, p = dst; i < n; i += 3 )
    {
        C1 = *src++;
        C2 = *src++;
        C3 = *src++;

        *p++ = base64_enc_map[(C1 >> 2) & 0x3F];
        *p++ = base64_enc_map[(((C1 &  3) << 4) + (C2 >> 4)) & 0x3F];
        *p++ = base64_enc_map[(((C2 & 15) << 2) + (C3 >> 6)) & 0x3F];
        *p++ = base64_enc_map[C3 & 0x3F];
    }

    if( i < slen )
    {
        C1 = *src++;
        C2 = ( ( i + 1 ) < slen ) ? *src++ : 0;

        *p++ = base64_enc_map[(C1 >> 2) & 0x3F];
        *p++ = base64_enc_map[(((C1 & 3) << 4) + (C2 >> 4)) & 0x3F];

        if( ( i + 1 ) < slen )
             *p++ = base64_enc_map[((C2 & 15) << 2) & 0x3F];
        else *p++ = '=';

        *p++ = '=';
    }

    *olen = p - dst;
    *p = 0;

    return( 0 );
}